

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O2

typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
VW::config::
typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
value(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::make_shared<std::__cxx11::string,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffe0);
  std::
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&(this->m_value).
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ,(__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                *)&stack0xffffffffffffffe0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return this;
}

Assistant:

typed_option& value(T value)
  {
    m_value = std::make_shared<T>(value);
    return *this;
  }